

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_compressStream_generic
                 (ZSTD_CStream *zcs,ZSTD_outBuffer *output,ZSTD_inBuffer *input,
                 ZSTD_EndDirective flushMode)

{
  ZSTD_cStreamStage ZVar1;
  char *pcVar2;
  void *pvVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  size_t sVar7;
  size_t sVar8;
  size_t local_110;
  bool local_f9;
  void *local_e8;
  void *local_e0;
  char *local_d8;
  char *local_d0;
  size_t flushed;
  size_t toFlush;
  size_t err_code_1;
  size_t sStack_a8;
  uint lastBlock;
  size_t oSize;
  size_t iSize;
  size_t cSize_1;
  void *cDst;
  size_t loaded;
  size_t toLoad;
  size_t err_code;
  size_t cSize;
  void *pvStack_60;
  U32 someMoreWork;
  char *op;
  char *oend;
  char *ostart;
  char *ip;
  char *iend;
  char *istart;
  ZSTD_EndDirective flushMode_local;
  ZSTD_inBuffer *input_local;
  ZSTD_outBuffer *output_local;
  ZSTD_CStream *zcs_local;
  
  pcVar2 = (char *)input->src;
  local_d0 = pcVar2;
  if (input->size != 0) {
    local_d0 = pcVar2 + input->size;
  }
  local_d8 = pcVar2;
  if (input->pos != 0) {
    local_d8 = pcVar2 + input->pos;
  }
  ostart = local_d8;
  pvVar3 = output->dst;
  local_e0 = pvVar3;
  if (output->size != 0) {
    local_e0 = (void *)((long)pvVar3 + output->size);
  }
  local_e8 = pvVar3;
  if (output->pos != 0) {
    local_e8 = (void *)((long)pvVar3 + output->pos);
  }
  pvStack_60 = local_e8;
  bVar4 = true;
  if (zcs->inBuff == (char *)0x0) {
    __assert_fail("zcs->inBuff != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x390d,
                  "size_t ZSTD_compressStream_generic(ZSTD_CStream *, ZSTD_outBuffer *, ZSTD_inBuffer *, const ZSTD_EndDirective)"
                 );
  }
  if (zcs->inBuffSize == 0) {
    __assert_fail("zcs->inBuffSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x390e,
                  "size_t ZSTD_compressStream_generic(ZSTD_CStream *, ZSTD_outBuffer *, ZSTD_inBuffer *, const ZSTD_EndDirective)"
                 );
  }
  if (zcs->outBuff == (char *)0x0) {
    __assert_fail("zcs->outBuff != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x390f,
                  "size_t ZSTD_compressStream_generic(ZSTD_CStream *, ZSTD_outBuffer *, ZSTD_inBuffer *, const ZSTD_EndDirective)"
                 );
  }
  if (zcs->outBuffSize == 0) {
    __assert_fail("zcs->outBuffSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x3910,
                  "size_t ZSTD_compressStream_generic(ZSTD_CStream *, ZSTD_outBuffer *, ZSTD_inBuffer *, const ZSTD_EndDirective)"
                 );
  }
  if (output->size < output->pos) {
    __assert_fail("output->pos <= output->size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x3911,
                  "size_t ZSTD_compressStream_generic(ZSTD_CStream *, ZSTD_outBuffer *, ZSTD_inBuffer *, const ZSTD_EndDirective)"
                 );
  }
  if (input->size < input->pos) {
    __assert_fail("input->pos <= input->size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x3912,
                  "size_t ZSTD_compressStream_generic(ZSTD_CStream *, ZSTD_outBuffer *, ZSTD_inBuffer *, const ZSTD_EndDirective)"
                 );
  }
LAB_001b4723:
  do {
    while( true ) {
      if (!bVar4) {
        input->pos = (long)ostart - (long)pcVar2;
        output->pos = (long)pvStack_60 - (long)pvVar3;
        if (zcs->frameEnded == 0) {
          zcs_local = (ZSTD_CStream *)ZSTD_nextInputSizeHint(zcs);
        }
        else {
          zcs_local = (ZSTD_CStream *)0x0;
        }
        return (size_t)zcs_local;
      }
      ZVar1 = zcs->streamStage;
      if (ZVar1 == zcss_init) {
        return 0xffffffffffffffc2;
      }
      if (ZVar1 == zcss_load) break;
      if (ZVar1 != zcss_flush) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x3981,
                      "size_t ZSTD_compressStream_generic(ZSTD_CStream *, ZSTD_outBuffer *, ZSTD_inBuffer *, const ZSTD_EndDirective)"
                     );
      }
LAB_001b4bcc:
      sVar7 = zcs->outBuffContentSize - zcs->outBuffFlushedSize;
      sVar8 = ZSTD_limitCopy(pvStack_60,(long)local_e0 - (long)pvStack_60,
                             zcs->outBuff + zcs->outBuffFlushedSize,sVar7);
      if (sVar8 != 0) {
        pvStack_60 = (void *)(sVar8 + (long)pvStack_60);
      }
      zcs->outBuffFlushedSize = sVar8 + zcs->outBuffFlushedSize;
      if (sVar7 == sVar8) {
        zcs->outBuffFlushedSize = 0;
        zcs->outBuffContentSize = 0;
        if (zcs->frameEnded == 0) {
          zcs->streamStage = zcss_load;
        }
        else {
          bVar4 = false;
          ZSTD_CCtx_reset(zcs,ZSTD_reset_session_only);
        }
      }
      else {
        if (pvStack_60 != local_e0) {
          __assert_fail("op==oend",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x3971,
                        "size_t ZSTD_compressStream_generic(ZSTD_CStream *, ZSTD_outBuffer *, ZSTD_inBuffer *, const ZSTD_EndDirective)"
                       );
        }
        bVar4 = false;
      }
    }
    if (((flushMode == ZSTD_e_end) &&
        (sVar7 = ZSTD_compressBound((long)local_d0 - (long)ostart),
        sVar7 <= (ulong)((long)local_e0 - (long)pvStack_60))) && (zcs->inBuffPos == 0)) {
      sVar7 = ZSTD_compressEnd(zcs,pvStack_60,(long)local_e0 - (long)pvStack_60,ostart,
                               (long)local_d0 - (long)ostart);
      uVar5 = ERR_isError(sVar7);
      if (uVar5 != 0) {
        return sVar7;
      }
      ostart = local_d0;
      pvStack_60 = (void *)(sVar7 + (long)pvStack_60);
      zcs->frameEnded = 1;
      ZSTD_CCtx_reset(zcs,ZSTD_reset_session_only);
      bVar4 = false;
      goto LAB_001b4723;
    }
    sVar7 = ZSTD_limitCopy(zcs->inBuff + zcs->inBuffPos,zcs->inBuffTarget - zcs->inBuffPos,ostart,
                           (long)local_d0 - (long)ostart);
    zcs->inBuffPos = sVar7 + zcs->inBuffPos;
    if (sVar7 != 0) {
      ostart = ostart + sVar7;
    }
    if ((flushMode == ZSTD_e_continue) && (zcs->inBuffPos < zcs->inBuffTarget)) {
      bVar4 = false;
    }
    else if ((flushMode == ZSTD_e_flush) && (zcs->inBuffPos == zcs->inToCompress)) {
      bVar4 = false;
    }
    else {
      sVar7 = zcs->inBuffPos - zcs->inToCompress;
      sStack_a8 = (long)local_e0 - (long)pvStack_60;
      local_f9 = flushMode == ZSTD_e_end && ostart == local_d0;
      uVar5 = (uint)local_f9;
      sVar8 = ZSTD_compressBound(sVar7);
      if (sStack_a8 < sVar8) {
        cSize_1 = (size_t)zcs->outBuff;
        sStack_a8 = zcs->outBuffSize;
      }
      else {
        cSize_1 = (size_t)pvStack_60;
      }
      if (uVar5 == 0) {
        local_110 = ZSTD_compressContinue
                              (zcs,(void *)cSize_1,sStack_a8,zcs->inBuff + zcs->inToCompress,sVar7);
      }
      else {
        local_110 = ZSTD_compressEnd(zcs,(void *)cSize_1,sStack_a8,zcs->inBuff + zcs->inToCompress,
                                     sVar7);
      }
      uVar6 = ERR_isError(local_110);
      if (uVar6 != 0) {
        return local_110;
      }
      zcs->frameEnded = uVar5;
      zcs->inBuffTarget = zcs->inBuffPos + zcs->blockSize;
      if (zcs->inBuffSize < zcs->inBuffTarget) {
        zcs->inBuffPos = 0;
        zcs->inBuffTarget = zcs->blockSize;
      }
      if ((uVar5 == 0) && (zcs->inBuffSize < zcs->inBuffTarget)) {
        __assert_fail("zcs->inBuffTarget <= zcs->inBuffSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x3955,
                      "size_t ZSTD_compressStream_generic(ZSTD_CStream *, ZSTD_outBuffer *, ZSTD_inBuffer *, const ZSTD_EndDirective)"
                     );
      }
      zcs->inToCompress = zcs->inBuffPos;
      if ((void *)cSize_1 != pvStack_60) {
        zcs->outBuffContentSize = local_110;
        zcs->outBuffFlushedSize = 0;
        zcs->streamStage = zcss_flush;
        goto LAB_001b4bcc;
      }
      pvStack_60 = (void *)(local_110 + (long)pvStack_60);
      if (zcs->frameEnded != 0) {
        bVar4 = false;
        ZSTD_CCtx_reset(zcs,ZSTD_reset_session_only);
      }
    }
  } while( true );
}

Assistant:

static size_t ZSTD_compressStream_generic(ZSTD_CStream* zcs,
                                          ZSTD_outBuffer* output,
                                          ZSTD_inBuffer* input,
                                          ZSTD_EndDirective const flushMode)
{
    const char* const istart = (const char*)input->src;
    const char* const iend = input->size != 0 ? istart + input->size : istart;
    const char* ip = input->pos != 0 ? istart + input->pos : istart;
    char* const ostart = (char*)output->dst;
    char* const oend = output->size != 0 ? ostart + output->size : ostart;
    char* op = output->pos != 0 ? ostart + output->pos : ostart;
    U32 someMoreWork = 1;

    /* check expectations */
    DEBUGLOG(5, "ZSTD_compressStream_generic, flush=%u", (unsigned)flushMode);
    assert(zcs->inBuff != NULL);
    assert(zcs->inBuffSize > 0);
    assert(zcs->outBuff !=  NULL);
    assert(zcs->outBuffSize > 0);
    assert(output->pos <= output->size);
    assert(input->pos <= input->size);

    while (someMoreWork) {
        switch(zcs->streamStage)
        {
        case zcss_init:
            RETURN_ERROR(init_missing, "call ZSTD_initCStream() first!");

        case zcss_load:
            if ( (flushMode == ZSTD_e_end)
              && ((size_t)(oend-op) >= ZSTD_compressBound(iend-ip))  /* enough dstCapacity */
              && (zcs->inBuffPos == 0) ) {
                /* shortcut to compression pass directly into output buffer */
                size_t const cSize = ZSTD_compressEnd(zcs,
                                                op, oend-op, ip, iend-ip);
                DEBUGLOG(4, "ZSTD_compressEnd : cSize=%u", (unsigned)cSize);
                FORWARD_IF_ERROR(cSize);
                ip = iend;
                op += cSize;
                zcs->frameEnded = 1;
                ZSTD_CCtx_reset(zcs, ZSTD_reset_session_only);
                someMoreWork = 0; break;
            }
            /* complete loading into inBuffer */
            {   size_t const toLoad = zcs->inBuffTarget - zcs->inBuffPos;
                size_t const loaded = ZSTD_limitCopy(
                                        zcs->inBuff + zcs->inBuffPos, toLoad,
                                        ip, iend-ip);
                zcs->inBuffPos += loaded;
                if (loaded != 0)
                    ip += loaded;
                if ( (flushMode == ZSTD_e_continue)
                  && (zcs->inBuffPos < zcs->inBuffTarget) ) {
                    /* not enough input to fill full block : stop here */
                    someMoreWork = 0; break;
                }
                if ( (flushMode == ZSTD_e_flush)
                  && (zcs->inBuffPos == zcs->inToCompress) ) {
                    /* empty */
                    someMoreWork = 0; break;
                }
            }
            /* compress current block (note : this stage cannot be stopped in the middle) */
            DEBUGLOG(5, "stream compression stage (flushMode==%u)", flushMode);
            {   void* cDst;
                size_t cSize;
                size_t const iSize = zcs->inBuffPos - zcs->inToCompress;
                size_t oSize = oend-op;
                unsigned const lastBlock = (flushMode == ZSTD_e_end) && (ip==iend);
                if (oSize >= ZSTD_compressBound(iSize))
                    cDst = op;   /* compress into output buffer, to skip flush stage */
                else
                    cDst = zcs->outBuff, oSize = zcs->outBuffSize;
                cSize = lastBlock ?
                        ZSTD_compressEnd(zcs, cDst, oSize,
                                    zcs->inBuff + zcs->inToCompress, iSize) :
                        ZSTD_compressContinue(zcs, cDst, oSize,
                                    zcs->inBuff + zcs->inToCompress, iSize);
                FORWARD_IF_ERROR(cSize);
                zcs->frameEnded = lastBlock;
                /* prepare next block */
                zcs->inBuffTarget = zcs->inBuffPos + zcs->blockSize;
                if (zcs->inBuffTarget > zcs->inBuffSize)
                    zcs->inBuffPos = 0, zcs->inBuffTarget = zcs->blockSize;
                DEBUGLOG(5, "inBuffTarget:%u / inBuffSize:%u",
                         (unsigned)zcs->inBuffTarget, (unsigned)zcs->inBuffSize);
                if (!lastBlock)
                    assert(zcs->inBuffTarget <= zcs->inBuffSize);
                zcs->inToCompress = zcs->inBuffPos;
                if (cDst == op) {  /* no need to flush */
                    op += cSize;
                    if (zcs->frameEnded) {
                        DEBUGLOG(5, "Frame completed directly in outBuffer");
                        someMoreWork = 0;
                        ZSTD_CCtx_reset(zcs, ZSTD_reset_session_only);
                    }
                    break;
                }
                zcs->outBuffContentSize = cSize;
                zcs->outBuffFlushedSize = 0;
                zcs->streamStage = zcss_flush; /* pass-through to flush stage */
            }
	    /* fall-through */
        case zcss_flush:
            DEBUGLOG(5, "flush stage");
            {   size_t const toFlush = zcs->outBuffContentSize - zcs->outBuffFlushedSize;
                size_t const flushed = ZSTD_limitCopy(op, (size_t)(oend-op),
                            zcs->outBuff + zcs->outBuffFlushedSize, toFlush);
                DEBUGLOG(5, "toFlush: %u into %u ==> flushed: %u",
                            (unsigned)toFlush, (unsigned)(oend-op), (unsigned)flushed);
                if (flushed)
                    op += flushed;
                zcs->outBuffFlushedSize += flushed;
                if (toFlush!=flushed) {
                    /* flush not fully completed, presumably because dst is too small */
                    assert(op==oend);
                    someMoreWork = 0;
                    break;
                }
                zcs->outBuffContentSize = zcs->outBuffFlushedSize = 0;
                if (zcs->frameEnded) {
                    DEBUGLOG(5, "Frame completed on flush");
                    someMoreWork = 0;
                    ZSTD_CCtx_reset(zcs, ZSTD_reset_session_only);
                    break;
                }
                zcs->streamStage = zcss_load;
                break;
            }

        default: /* impossible */
            assert(0);
        }
    }

    input->pos = ip - istart;
    output->pos = op - ostart;
    if (zcs->frameEnded) return 0;
    return ZSTD_nextInputSizeHint(zcs);
}